

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

Point3f __thiscall
ary::unprojectPoint(ary *this,Point2f *p,Matx33f *rotation,Matx31f *translation,Matx33f *intrinsics,
                   Mat *distortion)

{
  pointer *this_00;
  float fVar1;
  _InputArray *p_Var2;
  reference pvVar3;
  float *pfVar4;
  undefined8 extraout_XMM0_Qa;
  float fVar5;
  Point3f PVar6;
  double local_8b0;
  Mat local_8a8 [3];
  Mat local_748;
  Mat local_6e8 [3];
  MatExpr local_588 [352];
  undefined1 local_428 [8];
  Mat translationInv;
  undefined1 local_3a0 [8];
  Mat rotationInv;
  Matx<float,_3,_3> local_1dc;
  undefined1 local_1b8 [8];
  Mat intrInv;
  Mat LOS;
  float y;
  float x;
  _InputArray local_d8;
  _InputArray local_c0;
  _OutputArray local_a8;
  _InputArray local_90;
  undefined1 local_68 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> ptsOut;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> ptsIn;
  Mat *distortion_local;
  Matx33f *intrinsics_local;
  Matx31f *translation_local;
  Matx33f *rotation_local;
  Point2f *p_local;
  Point3f *r;
  
  this_00 = &ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this_00);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this_00,p);
  cv::_InputArray::_InputArray<cv::Point_<float>>
            (&local_90,
             (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
             &ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::_OutputArray<cv::Point_<float>>
            (&local_a8,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68);
  cv::_InputArray::_InputArray<float,3,3>(&local_c0,intrinsics);
  cv::_InputArray::_InputArray(&local_d8,distortion);
  p_Var2 = (_InputArray *)cv::noArray();
  cv::_InputArray::_InputArray<float,3,3>((_InputArray *)&y,intrinsics);
  cv::undistortPoints(&local_90,&local_a8,&local_c0,&local_d8,p_Var2,(_InputArray *)&y);
  cv::_InputArray::~_InputArray((_InputArray *)&y);
  cv::_InputArray::~_InputArray(&local_d8);
  cv::_InputArray::~_InputArray(&local_c0);
  cv::_OutputArray::~_OutputArray(&local_a8);
  cv::_InputArray::~_InputArray(&local_90);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68,0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68,0);
  cv::Mat::Mat((Mat *)(intrInv.step.buf + 1),3,1,5);
  pvVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                     ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68,0);
  fVar1 = pvVar3->x;
  pfVar4 = cv::Mat::at<float>((Mat *)(intrInv.step.buf + 1),0);
  *pfVar4 = fVar1;
  pvVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                     ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68,0);
  fVar1 = pvVar3->y;
  pfVar4 = cv::Mat::at<float>((Mat *)(intrInv.step.buf + 1),1);
  *pfVar4 = fVar1;
  pfVar4 = cv::Mat::at<float>((Mat *)(intrInv.step.buf + 1),2);
  *pfVar4 = 1.0;
  cv::Matx<float,_3,_3>::inv(&local_1dc,intrinsics,0,(bool *)0x0);
  cv::Mat::Mat<float,3,3>((Mat *)local_1b8,&local_1dc,true);
  cv::operator*((Mat *)(rotationInv.step.buf + 1),(Mat *)local_1b8);
  cv::Mat::operator=((Mat *)(intrInv.step.buf + 1),(MatExpr *)(rotationInv.step.buf + 1));
  cv::MatExpr::~MatExpr((MatExpr *)(rotationInv.step.buf + 1));
  cv::Matx<float,_3,_3>::t((Matx<float,_3,_3> *)((long)translationInv.step.buf + 0xc),rotation);
  cv::Mat::Mat<float,3,3>
            ((Mat *)local_3a0,(Matx<float,_3,_3> *)((long)translationInv.step.buf + 0xc),true);
  cv::operator-((cv *)local_6e8,(Mat *)local_3a0);
  cv::Mat::Mat<float,3,1>(&local_748,translation,true);
  cv::operator*(local_588,local_6e8);
  cv::MatExpr::operator_cast_to_Mat((Mat *)local_428,local_588);
  cv::MatExpr::~MatExpr(local_588);
  cv::Mat::~Mat(&local_748);
  cv::MatExpr::~MatExpr((MatExpr *)local_6e8);
  cv::operator*(local_8a8,(Mat *)local_3a0);
  cv::Mat::operator=((Mat *)(intrInv.step.buf + 1),(MatExpr *)local_8a8);
  cv::MatExpr::~MatExpr((MatExpr *)local_8a8);
  pfVar4 = cv::Mat::at<float>((Mat *)local_428,2);
  fVar1 = *pfVar4;
  pfVar4 = cv::Mat::at<float>((Mat *)(intrInv.step.buf + 1),2);
  local_8b0 = (double)-(fVar1 / *pfVar4);
  cv::operator*=((Mat *)(intrInv.step.buf + 1),&local_8b0);
  cv::Point3_<float>::Point3_((Point3_<float> *)this);
  pfVar4 = cv::Mat::at<float>((Mat *)(intrInv.step.buf + 1),0);
  fVar1 = *pfVar4;
  pfVar4 = cv::Mat::at<float>((Mat *)local_428,0);
  *(float *)this = fVar1 + *pfVar4;
  pfVar4 = cv::Mat::at<float>((Mat *)(intrInv.step.buf + 1),1);
  fVar1 = *pfVar4;
  pfVar4 = cv::Mat::at<float>((Mat *)local_428,1);
  fVar5 = *pfVar4;
  *(float *)(this + 4) = fVar1 + fVar5;
  pfVar4 = cv::Mat::at<float>((Mat *)(intrInv.step.buf + 1),2);
  fVar1 = *pfVar4;
  pfVar4 = cv::Mat::at<float>((Mat *)local_428,2);
  *(float *)(this + 8) = fVar1 + *pfVar4;
  cv::Mat::~Mat((Mat *)local_428);
  cv::Mat::~Mat((Mat *)local_3a0);
  cv::Mat::~Mat((Mat *)local_1b8);
  cv::Mat::~Mat((Mat *)(intrInv.step.buf + 1));
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_68);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
             &ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  PVar6.z = fVar5;
  PVar6.x = (float)(int)extraout_XMM0_Qa;
  PVar6.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return PVar6;
}

Assistant:

Point3f unprojectPoint(Point2f p, const Matx33f& rotation, const Matx31f& translation, const Matx33f& intrinsics, const Mat& distortion) {

	std::vector<Point2f> ptsIn, ptsOut;
    ptsIn.push_back(p);
    undistortPoints(ptsIn, ptsOut, intrinsics, distortion, noArray(), intrinsics);

    float x = ptsOut[0].x;
    float y = ptsOut[0].y;

    Mat LOS(3,1,CV_32F);

    LOS.at<float>(0) = ptsOut[0].x;
    LOS.at<float>(1) = ptsOut[0].y;
    LOS.at<float>(2) = 1;

	Mat intrInv = Mat(intrinsics.inv());
    LOS = intrInv * LOS;

    Mat rotationInv = Mat(rotation.t());
    Mat translationInv = (-rotationInv * Mat(translation));
	LOS = rotationInv * LOS;

	LOS *= -(translationInv.at<float>(2) / LOS.at<float>(2));
	Point3f r;

	r.x = LOS.at<float>(0) + translationInv.at<float>(0);
	r.y = LOS.at<float>(1) + translationInv.at<float>(1);
	r.z = LOS.at<float>(2) + translationInv.at<float>(2);

	return r;
}